

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzerSettings.cpp
# Opt level: O0

char * __thiscall SimpleParallelAnalyzerSettings::SaveSettings(SimpleParallelAnalyzerSettings *this)

{
  size_type sVar1;
  reference pvVar2;
  char *pcVar3;
  uint local_20;
  U32 i;
  U32 count;
  SimpleArchive text_archive;
  SimpleParallelAnalyzerSettings *this_local;
  
  _text_archive = this;
  SimpleArchive::SimpleArchive((SimpleArchive *)&i);
  sVar1 = std::vector<Channel,_std::allocator<Channel>_>::size(&this->mDataChannels);
  for (local_20 = 0; local_20 < (uint)sVar1; local_20 = local_20 + 1) {
    pvVar2 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                       (&this->mDataChannels,(ulong)local_20);
    SimpleArchive::operator<<((SimpleArchive *)&i,pvVar2);
  }
  SimpleArchive::operator<<((SimpleArchive *)&i,&this->mClockChannel);
  SimpleArchive::operator<<((SimpleArchive *)&i,this->mClockEdge);
  SimpleArchive::GetString();
  pcVar3 = (char *)AnalyzerSettings::SetReturnString((char *)this);
  SimpleArchive::~SimpleArchive((SimpleArchive *)&i);
  return pcVar3;
}

Assistant:

const char* SimpleParallelAnalyzerSettings::SaveSettings()
{
	SimpleArchive text_archive;

		U32 count = (U32)mDataChannels.size();

	for( U32 i=0; i<count; i++ )
	{
		text_archive << mDataChannels[i];
	}

	text_archive << mClockChannel;
	text_archive << mClockEdge;

	return SetReturnString( text_archive.GetString() );
}